

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvector_serial.c
# Opt level: O1

int N_VConstVectorArray_Serial(int nvec,realtype c,N_Vector *Z)

{
  long lVar1;
  long lVar2;
  sunindextype N;
  ulong uVar3;
  long lVar4;
  
  if (nvec < 1) {
    return -1;
  }
  lVar1 = *(*Z)->content;
  if (nvec == 1) {
    if (0 < lVar1) {
      lVar2 = *(long *)((long)(*Z)->content + 0x10);
      lVar4 = 0;
      do {
        *(realtype *)(lVar2 + lVar4 * 8) = c;
        lVar4 = lVar4 + 1;
      } while (lVar1 != lVar4);
      return 0;
    }
  }
  else {
    uVar3 = 0;
    do {
      if (0 < lVar1) {
        lVar2 = *(long *)((long)Z[uVar3]->content + 0x10);
        lVar4 = 0;
        do {
          *(realtype *)(lVar2 + lVar4 * 8) = c;
          lVar4 = lVar4 + 1;
        } while (lVar1 != lVar4);
      }
      uVar3 = uVar3 + 1;
    } while (uVar3 != (uint)nvec);
  }
  return 0;
}

Assistant:

int N_VConstVectorArray_Serial(int nvec, realtype c, N_Vector* Z)
{
  int          i;
  sunindextype j, N;
  realtype*    zd=NULL;

  /* invalid number of vectors */
  if (nvec < 1) return(-1);

  /* should have called N_VConst */
  if (nvec == 1) {
    N_VConst_Serial(c, Z[0]);
    return(0);
  }

  /* get vector length */
  N = NV_LENGTH_S(Z[0]);

  /* set each vector in the vector array to a constant */
  for (i=0; i<nvec; i++) {
    zd = NV_DATA_S(Z[i]);
    for (j=0; j<N; j++) {
      zd[j] = c;
    }
  }

  return(0);
}